

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
               (Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
                *m)

{
  undefined4 local_118;
  int local_114;
  undefined1 *local_110;
  int *local_108;
  undefined1 local_100 [8];
  undefined8 local_f8;
  shared_count sStack_f0;
  char *local_e8;
  char *local_e0;
  initializer_list<unsigned_int> local_d8;
  undefined8 *local_c8;
  int **local_c0;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined **local_90;
  undefined1 local_88;
  undefined8 *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  initializer_list<unsigned_int> local_50;
  undefined8 *local_40;
  undefined1 **local_38;
  
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x39f);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_00251de8;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_114 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_108 = &local_114;
  local_118 = 2;
  local_100[0] = local_114 == 2;
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e0 = "";
  local_c0 = &local_108;
  local_d8._M_len = local_d8._M_len & 0xffffffffffffff00;
  local_d8._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_50._M_len = local_50._M_len & 0xffffffffffffff00;
  local_38 = &local_110;
  local_50._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_110 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f0);
  local_d8._M_array = (iterator)0x100000000;
  local_d8._M_len = 0x300000002;
  local_c8 = (undefined8 *)0x500000004;
  local_50._M_len = 6;
  local_50._M_array = (iterator)&local_d8;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
              *)&m->matrix_,&local_50,-1);
  local_50._M_array = (iterator)0x100000000;
  local_50._M_len = 0x300000002;
  local_d8._M_len = 4;
  local_d8._M_array = (iterator)&local_50;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
              *)&m->matrix_,&local_d8,-1);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3a9);
  local_88 = 0;
  local_90 = &PTR__lazy_ostream_00251de8;
  local_80 = &boost::unit_test::lazy_ostream::inst;
  local_78 = "";
  local_114 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_100[0] = local_114 == 5;
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e0 = "";
  local_108 = &local_114;
  local_d8._M_len = local_d8._M_len & 0xffffffffffffff00;
  local_d8._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_108;
  local_50._M_len = local_50._M_len & 0xffffffffffffff00;
  local_50._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = &local_110;
  local_118 = 5;
  local_110 = (undefined1 *)&local_118;
  boost::test_tools::tt_detail::report_assertion
            (local_100,&local_90,&local_e8,0x3a9,1,2,2,"m.get_max_dimension()",&local_d8,"5",
             &local_50);
  boost::detail::shared_count::~shared_count(&sStack_f0);
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}